

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O1

void Gia_VtaPrintMemory(Vta_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  sat_solver2 *s;
  int *piVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  
  iVar1 = p->pGia->nObjs;
  dVar11 = sat_solver2_memory(p->pSat,1);
  s = p->pSat;
  dVar12 = sat_solver2_memory_proof(s);
  iVar9 = (int)s;
  pVVar3 = p->vFrames;
  dVar28 = 0.0;
  dVar13 = 0.0;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    iVar2 = pVVar3->nCap;
    auVar16._8_4_ = iVar2 >> 0x1f;
    auVar16._0_8_ = (long)iVar2;
    auVar16._12_4_ = 0x45300000;
    dVar13 = ((auVar16._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0)) * 8.0 + 16.0;
    if (0 < (long)pVVar3->nSize) {
      lVar7 = 0;
      do {
        piVar10 = (int *)pVVar3->pArray[lVar7];
        if (piVar10 != (int *)0x0) {
          iVar9 = *piVar10;
          piVar10 = (int *)(long)iVar9;
          auVar26._8_4_ = iVar9 >> 0x1f;
          auVar26._0_8_ = piVar10;
          auVar26._12_4_ = 0x45300000;
          dVar13 = dVar13 + ((auVar26._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,iVar9) - 4503599627370496.0)) * 4.0 + 16.0;
        }
        iVar9 = (int)piVar10;
        lVar7 = lVar7 + 1;
      } while (pVVar3->nSize != lVar7);
    }
  }
  pVVar3 = p->vCores;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    iVar9 = pVVar3->nCap;
    auVar17._8_4_ = iVar9 >> 0x1f;
    auVar17._0_8_ = (long)iVar9;
    auVar17._12_4_ = 0x45300000;
    dVar28 = ((auVar17._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar9) - 4503599627370496.0)) * 8.0 + 16.0;
    iVar9 = pVVar3->nSize;
    if (0 < (long)iVar9) {
      lVar7 = 0;
      do {
        if ((int *)pVVar3->pArray[lVar7] != (int *)0x0) {
          iVar2 = *pVVar3->pArray[lVar7];
          auVar27._8_4_ = iVar2 >> 0x1f;
          auVar27._0_8_ = (long)iVar2;
          auVar27._12_4_ = 0x45300000;
          dVar28 = dVar28 + ((auVar27._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0)) * 4.0 + 16.0;
        }
        lVar7 = lVar7 + 1;
      } while (iVar9 != lVar7);
    }
  }
  lVar8 = (long)p->vOrder->nCap << 2;
  auVar18._8_4_ = (int)((ulong)lVar8 >> 0x20);
  auVar18._0_8_ = lVar8;
  auVar18._12_4_ = 0x45300000;
  lVar6 = (long)p->vSeenGla->nCap << 2;
  auVar19._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar19._0_8_ = lVar6;
  auVar19._12_4_ = 0x45300000;
  lVar7 = (long)p->nObjsAlloc * 0x10 + (long)p->nBins * 4;
  auVar20._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar20._0_8_ = lVar7;
  auVar20._12_4_ = 0x45300000;
  dVar23 = (auVar20._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0);
  lVar7 = (long)iVar1 * 0xc;
  auVar21._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar21._0_8_ = lVar7;
  auVar21._12_4_ = 0x45300000;
  dVar25 = (auVar21._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0);
  lVar7 = (long)p->vAddedNew->nCap << 2;
  auVar22._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar22._0_8_ = lVar7;
  auVar22._12_4_ = 0x45300000;
  dVar14 = (auVar22._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0) +
           (auVar19._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0) +
           (auVar18._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0) + 168.0 + dVar13 + dVar28;
  dVar13 = dVar11 + dVar25 + dVar12 + dVar23 + dVar14;
  Abc_Print(iVar9,"%s =","Memory: AIG     ");
  bVar4 = NAN(dVar13);
  bVar5 = dVar13 == 0.0;
  dVar28 = (dVar25 * 100.0) / dVar13;
  if ((bVar5) && (!bVar4)) {
    dVar28 = 0.0;
  }
  dVar15 = (dVar11 * 100.0) / dVar13;
  if ((bVar5) && (!bVar4)) {
    dVar15 = 0.0;
  }
  dVar29 = (dVar12 * 100.0) / dVar13;
  if ((bVar5) && (!bVar4)) {
    dVar29 = 0.0;
  }
  dVar30 = (dVar23 * 100.0) / dVar13;
  if ((bVar5) && (!bVar4)) {
    dVar30 = 0.0;
  }
  dVar31 = (dVar14 * 100.0) / dVar13;
  if ((bVar5) && (!bVar4)) {
    dVar31 = 0.0;
  }
  dVar24 = (dVar13 * 100.0) / dVar13;
  if ((bVar5) && (!bVar4)) {
    dVar24 = 0.0;
  }
  Abc_Print(iVar9,"%10.3f MB (%6.2f %%)\n",dVar25 * 9.5367431640625e-07,dVar28);
  Abc_Print(iVar9,"%s =","Memory: SAT     ");
  Abc_Print(iVar9,"%10.3f MB (%6.2f %%)\n",dVar11 * 9.5367431640625e-07,dVar15);
  Abc_Print(iVar9,"%s =","Memory: Proof   ");
  Abc_Print(iVar9,"%10.3f MB (%6.2f %%)\n",dVar12 * 9.5367431640625e-07,dVar29);
  Abc_Print(iVar9,"%s =","Memory: Map     ");
  Abc_Print(iVar9,"%10.3f MB (%6.2f %%)\n",dVar23 * 9.5367431640625e-07,dVar30);
  Abc_Print(iVar9,"%s =","Memory: Other   ");
  Abc_Print(iVar9,"%10.3f MB (%6.2f %%)\n",dVar14 * 9.5367431640625e-07,dVar31);
  Abc_Print(iVar9,"%s =","Memory: TOTAL   ");
  Abc_Print(iVar9,"%10.3f MB (%6.2f %%)\n",dVar13 * 9.5367431640625e-07,dVar24);
  return;
}

Assistant:

void Gia_VtaPrintMemory( Vta_Man_t * p )
{
    double memTot = 0;
    double memAig = Gia_ManObjNum(p->pGia) * sizeof(Gia_Obj_t);
    double memSat = sat_solver2_memory( p->pSat, 1 );
    double memPro = sat_solver2_memory_proof( p->pSat );
    double memMap = p->nObjsAlloc * sizeof(Vta_Obj_t) + p->nBins * sizeof(int);
    double memOth = sizeof(Vta_Man_t);
    memOth += Vec_IntCap(p->vOrder) * sizeof(int);
    memOth += Vec_VecMemoryInt( (Vec_Vec_t *)p->vFrames );
    memOth += Vec_BitCap(p->vSeenGla) * sizeof(int);
    memOth += Vec_VecMemoryInt( (Vec_Vec_t *)p->vCores );
    memOth += Vec_IntCap(p->vAddedNew) * sizeof(int);
    memTot = memAig + memSat + memPro + memMap + memOth;
    ABC_PRMP( "Memory: AIG     ", memAig, memTot );
    ABC_PRMP( "Memory: SAT     ", memSat, memTot );
    ABC_PRMP( "Memory: Proof   ", memPro, memTot );
    ABC_PRMP( "Memory: Map     ", memMap, memTot );
    ABC_PRMP( "Memory: Other   ", memOth, memTot );
    ABC_PRMP( "Memory: TOTAL   ", memTot, memTot );
}